

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportFileGenerator::ResolveTargetsInGeneratorExpression
          (cmExportFileGenerator *this,string *input,cmTarget *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  size_type sVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  string errorString;
  string targetName_1;
  string local_90;
  cmExportFileGenerator *local_70;
  cmTarget *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  string local_58;
  cmMakefile *local_38;
  
  local_38 = target->Makefile;
  local_70 = this;
  local_68 = target;
  local_60 = missingTargets;
  lVar3 = std::__cxx11::string::find((char *)input,0x59f106,0);
  if (lVar3 != -1) {
    do {
      uVar8 = lVar3 + 0x12;
      uVar4 = std::__cxx11::string::find((char *)input,0x591d27,uVar8);
      uVar5 = std::__cxx11::string::find((char *)input,0x5b8b5d,uVar8);
      uVar6 = std::__cxx11::string::find((char *)input,0x59e1c8,uVar8);
      if ((((uVar5 <= uVar6) && (uVar5 <= uVar4)) && (uVar4 != 0xffffffffffffffff)) &&
         (uVar5 != 0xffffffffffffffff)) {
        std::__cxx11::string::substr((ulong)&local_90,(ulong)input);
        bVar2 = AddTargetNamespace(local_70,&local_90,local_68,local_60);
        if (bVar2) {
          std::__cxx11::string::replace
                    ((ulong)input,uVar8,(char *)(uVar5 - uVar8),(ulong)local_90._M_dataplus._M_p);
        }
        sVar1 = local_90._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                   local_90.field_2._M_local_buf[0]) + 1);
        }
        uVar8 = sVar1 + lVar3 + 0x13;
      }
      lVar3 = std::__cxx11::string::find((char *)input,0x59f106,uVar8);
    } while (lVar3 != -1);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  uVar8 = 0;
  do {
    uVar4 = std::__cxx11::string::find((char *)input,0x59f564,uVar8);
    if (uVar4 == 0xffffffffffffffff) break;
    uVar5 = std::__cxx11::string::find((char *)input,0x591d27,uVar4 + 0xe);
    if (uVar5 == 0xffffffffffffffff) {
      bVar2 = false;
      std::__cxx11::string::_M_replace
                ((ulong)&local_90,0,(char *)local_90._M_string_length,0x5b2710);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_58,(ulong)input);
      lVar3 = std::__cxx11::string::find((char *)&local_58,0x59e1c8,0);
      pcVar7 = "$<TARGET_NAME:...> requires its parameter to be a literal.";
      if (lVar3 == -1) {
        bVar2 = AddTargetNamespace(local_70,&local_58,local_68,local_60);
        pcVar7 = "$<TARGET_NAME:...> requires its parameter to be a reachable target.";
        if (!bVar2) goto LAB_0042eea8;
        std::__cxx11::string::replace
                  ((ulong)input,uVar4,(char *)((uVar5 - uVar4) + 1),(ulong)local_58._M_dataplus._M_p
                  );
        bVar2 = true;
        uVar8 = uVar5;
      }
      else {
LAB_0042eea8:
        bVar2 = false;
        std::__cxx11::string::_M_replace
                  ((ulong)&local_90,0,(char *)local_90._M_string_length,(ulong)pcVar7);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
  } while (bVar2);
  (*local_70->_vptr_cmExportFileGenerator[5])(local_70,input);
  if ((char *)local_90._M_string_length != (char *)0x0) {
    cmMakefile::IssueMessage(local_38,FATAL_ERROR,&local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void
cmExportFileGenerator::ResolveTargetsInGeneratorExpression(
                                    std::string &input,
                                    cmTarget* target,
                                    std::vector<std::string> &missingTargets)
{
  std::string::size_type pos = 0;
  std::string::size_type lastPos = pos;

  cmMakefile *mf = target->GetMakefile();

  while((pos = input.find("$<TARGET_PROPERTY:", lastPos)) != input.npos)
    {
    std::string::size_type nameStartPos = pos +
                                            sizeof("$<TARGET_PROPERTY:") - 1;
    std::string::size_type closePos = input.find(">", nameStartPos);
    std::string::size_type commaPos = input.find(",", nameStartPos);
    std::string::size_type nextOpenPos = input.find("$<", nameStartPos);
    if (commaPos == input.npos // Implied 'this' target
        || closePos == input.npos // Imcomplete expression.
        || closePos < commaPos // Implied 'this' target
        || nextOpenPos < commaPos) // Non-literal
      {
      lastPos = nameStartPos;
      continue;
      }

    std::string targetName = input.substr(nameStartPos,
                                                commaPos - nameStartPos);

    if (this->AddTargetNamespace(targetName, target, missingTargets))
      {
      input.replace(nameStartPos, commaPos - nameStartPos, targetName);
      }
    lastPos = nameStartPos + targetName.size() + 1;
    }

  std::string errorString;
  pos = 0;
  lastPos = pos;
  while((pos = input.find("$<TARGET_NAME:", lastPos)) != input.npos)
    {
    std::string::size_type nameStartPos = pos + sizeof("$<TARGET_NAME:") - 1;
    std::string::size_type endPos = input.find(">", nameStartPos);
    if (endPos == input.npos)
      {
      errorString = "$<TARGET_NAME:...> expression incomplete";
      break;
      }
    std::string targetName = input.substr(nameStartPos,
                                                endPos - nameStartPos);
    if(targetName.find("$<") != input.npos)
      {
      errorString = "$<TARGET_NAME:...> requires its parameter to be a "
                    "literal.";
      break;
      }
    if (!this->AddTargetNamespace(targetName, target, missingTargets))
      {
      errorString = "$<TARGET_NAME:...> requires its parameter to be a "
                    "reachable target.";
      break;
      }
    input.replace(pos, endPos - pos + 1, targetName);
    lastPos = endPos;
    }

  this->ReplaceInstallPrefix(input);

  if (!errorString.empty())
    {
    mf->IssueMessage(cmake::FATAL_ERROR, errorString);
    }
}